

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

size_t nifti_write_buffer(znzFile fp,void *buffer,size_t numbytes)

{
  size_t sVar1;
  
  if (fp != (znzFile)0x0) {
    sVar1 = znzwrite(buffer,1,numbytes,fp);
    return sVar1;
  }
  nifti_write_buffer_cold_1();
  return 0;
}

Assistant:

size_t nifti_write_buffer(znzFile fp, const void *buffer, size_t numbytes)
{
   /* Write all the image data at once (no swapping here) */
   size_t ss;
   if (znz_isnull(fp)){
      fprintf(stderr,"** ERROR: nifti_write_buffer: null file pointer\n");
      return 0;
   }
   ss = znzwrite( (const void*)buffer , 1 , numbytes , fp ) ;
   return ss;
}